

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

inform_dist * inform_dist_uniform(size_t n)

{
  inform_dist *piVar1;
  ulong local_20;
  size_t i;
  inform_dist *dist;
  size_t n_local;
  
  piVar1 = inform_dist_alloc(n);
  if (piVar1 != (inform_dist *)0x0) {
    piVar1->counts = n;
    for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
      piVar1->histogram[local_20] = 1;
    }
  }
  return piVar1;
}

Assistant:

inform_dist* inform_dist_uniform(size_t n)
{
    // construct a distribution of the desired size
    inform_dist *dist = inform_dist_alloc(n);
    if (dist != NULL)
    {
        // set the counts to the number of states
        dist->counts = n;
        // set the count for each state to 1
        for (size_t i = 0; i < n; ++i) dist->histogram[i] = 1;
    }
    return dist;
}